

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

uint32_t phmap::priv::TrailingZeros<unsigned_char>(uchar x)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t res;
  uchar x_local;
  
  uVar1 = 0;
  for (uVar2 = (uint)x; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1 | 0x80000000) {
    uVar1 = uVar1 + 1;
  }
  return uVar1;
}

Assistant:

uint32_t TrailingZeros(T x) {
    uint32_t res;
    PHMAP_IF_CONSTEXPR(sizeof(T) == 8)
        res = base_internal::CountTrailingZerosNonZero64(static_cast<uint64_t>(x));
    else
        res = base_internal::CountTrailingZerosNonZero32(static_cast<uint32_t>(x));
    return res;
}